

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.cc
# Opt level: O1

void __thiscall StackSolver::solve(StackSolver *this)

{
  int iVar1;
  pointer piVar2;
  pointer pSVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int varnum;
  int iVar7;
  long lVar8;
  ulong uVar9;
  value_type_conflict2 local_34;
  
  piVar2 = (this->soln).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->soln).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar2) {
    (this->soln).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar2;
  }
  local_34 = 0xffff;
  std::vector<int,_std::allocator<int>_>::resize
            (&this->soln,
             (long)(this->vnlist).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->vnlist).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3,&local_34);
  duplicate(this);
  propagate(this,0,0);
  uVar4 = (int)((long)(this->guess).super__Vector_base<StackEqn,_std::allocator<StackEqn>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->guess).super__Vector_base<StackEqn,_std::allocator<StackEqn>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) * -0x55555555;
  iVar6 = uVar4 + 2;
  do {
    iVar7 = 0;
    if (0 < (int)uVar4) {
      iVar7 = 0;
      lVar8 = 8;
      uVar9 = (ulong)(uVar4 & 0x7fffffff);
      do {
        pSVar3 = (this->guess).super__Vector_base<StackEqn,_std::allocator<StackEqn>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar2 = (this->soln).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar1 = *(int *)((long)pSVar3 + lVar8 + -8);
        varnum = *(int *)((long)pSVar3 + lVar8 + -4);
        iVar5 = piVar2[iVar1];
        if (iVar5 == 0xffff) {
LAB_002dfe4b:
          if (piVar2[varnum] == 0xffff) {
            if (iVar5 == 0xffff) {
              iVar7 = iVar7 + (uint)(piVar2[varnum] == 0xffff);
            }
          }
          else {
            iVar5 = piVar2[varnum] + *(int *)((long)&pSVar3->var1 + lVar8);
            varnum = iVar1;
LAB_002dfe8f:
            propagate(this,varnum,iVar5);
          }
        }
        else {
          if (piVar2[varnum] == 0xffff) {
            iVar5 = iVar5 - *(int *)((long)&pSVar3->var1 + lVar8);
            goto LAB_002dfe8f;
          }
          if (iVar5 == 0xffff) goto LAB_002dfe4b;
        }
        lVar8 = lVar8 + 0xc;
        uVar9 = uVar9 - 1;
      } while (uVar9 != 0);
    }
    if ((iVar7 == iVar6) || (iVar6 = iVar7, iVar7 < 1)) {
      return;
    }
  } while( true );
}

Assistant:

void StackSolver::solve(void)

{
  // Use guesses to resolve subsystems not uniquely determined
  int4 i,size,var1,var2,count,lastcount;

  soln.clear();
  soln.resize(vnlist.size(),65535); // Initialize solutions vector
  duplicate();			// Duplicate and sort the equations

  propagate(0,0);		// We know one variable
  size = guess.size();
  lastcount = size+2;
  do {
    count = 0;
    for(i=0;i<size;++i) {
      var1 = guess[i].var1;
      var2 = guess[i].var2;
      if ((soln[var1]!=65535)&&(soln[var2]==65535))
	propagate(var2,soln[var1]-guess[i].rhs);
      else if ((soln[var1]==65535)&&(soln[var2]!=65535))
	propagate(var1,soln[var2]+guess[i].rhs);
      else if ((soln[var1]==65535)&&(soln[var2]==65535))
	count += 1;
    }
    if (count == lastcount) break;
    lastcount = count;
  } while(count > 0);
}